

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O0

void write_marking(MppWriteCtx *s,H264eMarkingInfo *marking)

{
  uint uVar1;
  RK_S32 RVar2;
  MPP_RET MVar3;
  undefined1 local_2c [8];
  H264eMmco mmco;
  H264eMarkingInfo *marking_local;
  MppWriteCtx *s_local;
  
  mmco._12_8_ = marking;
  if (marking->idr_flag == 0) {
    if ((h264e_debug & 0x400) != 0) {
      _mpp_log_l(4,"h264e_slice","mmco count %d\n","write_marking",(ulong)(uint)marking->wr_cnt);
    }
    h264e_marking_rd_rewind((H264eMarkingInfo *)mmco._12_8_);
    RVar2 = h264e_marking_is_empty((H264eMarkingInfo *)mmco._12_8_);
    if (RVar2 == 0) {
      mpp_writer_put_bits(s,1,1);
      if ((h264e_debug & 0x40) != 0) {
        uVar1 = mpp_writer_bits(s);
        _mpp_log_l(4,"h264e_slice","used bit %2d adaptive_ref_pic_marking_mode_flag 1\n",
                   "write_marking",(ulong)uVar1);
      }
      while (MVar3 = h264e_marking_rd_op((H264eMarkingInfo *)mmco._12_8_,(H264eMmco *)local_2c),
            MVar3 == MPP_OK) {
        mpp_writer_put_ue(s,local_2c._0_4_);
        if ((h264e_debug & 0x40) != 0) {
          uVar1 = mpp_writer_bits(s);
          _mpp_log_l(4,"h264e_slice","used bit %2d memory_management_control_operation %d\n",
                     "write_marking",(ulong)uVar1,(ulong)(uint)local_2c._0_4_);
        }
        switch(local_2c._0_4_) {
        case 1:
          mpp_writer_put_ue(s,local_2c._4_4_);
          if ((h264e_debug & 0x40) != 0) {
            uVar1 = mpp_writer_bits(s);
            _mpp_log_l(4,"h264e_slice","used bit %2d difference_of_pic_nums_minus1 %d\n",
                       "write_marking",(ulong)uVar1,(ulong)(uint)local_2c._4_4_);
          }
          break;
        case 2:
          mpp_writer_put_ue(s,mmco.mmco);
          if ((h264e_debug & 0x40) != 0) {
            uVar1 = mpp_writer_bits(s);
            _mpp_log_l(4,"h264e_slice","used bit %2d long_term_pic_num %d\n","write_marking",
                       (ulong)uVar1,(ulong)(uint)mmco.mmco);
          }
          break;
        case 3:
          mpp_writer_put_ue(s,local_2c._4_4_);
          if ((h264e_debug & 0x40) != 0) {
            uVar1 = mpp_writer_bits(s);
            _mpp_log_l(4,"h264e_slice","used bit %2d difference_of_pic_nums_minus1 %d\n",
                       "write_marking",(ulong)uVar1,(ulong)(uint)local_2c._4_4_);
          }
          mpp_writer_put_ue(s,mmco.difference_of_pic_nums_minus1);
          if ((h264e_debug & 0x40) != 0) {
            uVar1 = mpp_writer_bits(s);
            _mpp_log_l(4,"h264e_slice","used bit %2d long_term_frame_idx %d\n","write_marking",
                       (ulong)uVar1,(ulong)(uint)mmco.difference_of_pic_nums_minus1);
          }
          break;
        case 4:
          mpp_writer_put_ue(s,mmco.long_term_pic_num);
          if ((h264e_debug & 0x40) != 0) {
            uVar1 = mpp_writer_bits(s);
            _mpp_log_l(4,"h264e_slice","used bit %2d max_long_term_frame_idx_plus1 %d\n",
                       "write_marking",(ulong)uVar1,(ulong)(uint)mmco.long_term_pic_num);
          }
          break;
        case 5:
          break;
        case 6:
          mpp_writer_put_ue(s,mmco.difference_of_pic_nums_minus1);
          if ((h264e_debug & 0x40) != 0) {
            uVar1 = mpp_writer_bits(s);
            _mpp_log_l(4,"h264e_slice","used bit %2d long_term_frame_idx %d\n","write_marking",
                       (ulong)uVar1,(ulong)(uint)mmco.difference_of_pic_nums_minus1);
          }
          break;
        default:
          _mpp_log_l(2,"h264e_slice","invalid mmco %d\n","write_marking",(ulong)(uint)local_2c._0_4_
                    );
        }
      }
      mpp_writer_put_ue(s,0);
      if ((h264e_debug & 0x40) != 0) {
        uVar1 = mpp_writer_bits(s);
        _mpp_log_l(4,"h264e_slice","used bit %2d memory_management_control_operation 0\n",
                   "write_marking",(ulong)uVar1);
      }
    }
    else {
      mpp_writer_put_bits(s,0,1);
      if ((h264e_debug & 0x40) != 0) {
        uVar1 = mpp_writer_bits(s);
        _mpp_log_l(4,"h264e_slice","used bit %2d adaptive_ref_pic_marking_mode_flag 0\n",
                   "write_marking",(ulong)uVar1);
      }
    }
  }
  else {
    mpp_writer_put_bits(s,marking->no_output_of_prior_pics,1);
    if ((h264e_debug & 0x40) != 0) {
      uVar1 = mpp_writer_bits(s);
      _mpp_log_l(4,"h264e_slice","used bit %2d no_output_of_prior_pics_flag %d\n","write_marking",
                 (ulong)uVar1,(ulong)*(uint *)(mmco._12_8_ + 4));
    }
    mpp_writer_put_bits(s,*(RK_S32 *)(mmco._12_8_ + 8),1);
    if ((h264e_debug & 0x40) != 0) {
      uVar1 = mpp_writer_bits(s);
      _mpp_log_l(4,"h264e_slice","used bit %2d long_term_reference_flag %d\n","write_marking",
                 (ulong)uVar1,(ulong)*(uint *)(mmco._12_8_ + 8));
    }
  }
  return;
}

Assistant:

void write_marking(MppWriteCtx *s, H264eMarkingInfo *marking)
{
    if (marking->idr_flag) {
        /* no_output_of_prior_pics_flag */
        mpp_writer_put_bits(s, marking->no_output_of_prior_pics, 1);
        h264e_dbg_slice("used bit %2d no_output_of_prior_pics_flag %d\n",
                        mpp_writer_bits(s), marking->no_output_of_prior_pics);

        /* long_term_reference_flag */
        mpp_writer_put_bits(s, marking->long_term_reference_flag, 1);
        h264e_dbg_slice("used bit %2d long_term_reference_flag %d\n",
                        mpp_writer_bits(s), marking->long_term_reference_flag);
    } else {
        h264e_dbg_mmco("mmco count %d\n", marking->wr_cnt);

        h264e_marking_rd_rewind(marking);

        if (!h264e_marking_is_empty(marking)) {
            H264eMmco mmco;

            /* adaptive_ref_pic_marking_mode_flag */
            mpp_writer_put_bits(s, 1, 1);
            h264e_dbg_slice("used bit %2d adaptive_ref_pic_marking_mode_flag 1\n",
                            mpp_writer_bits(s));

            while (MPP_OK == h264e_marking_rd_op(marking, &mmco)) {
                /* memory_management_control_operation */
                mpp_writer_put_ue(s, mmco.mmco);
                h264e_dbg_slice("used bit %2d memory_management_control_operation %d\n",
                                mpp_writer_bits(s), mmco.mmco);

                switch (mmco.mmco) {
                case 1 : {
                    /* difference_of_pic_nums_minus1 */
                    mpp_writer_put_ue(s, mmco.difference_of_pic_nums_minus1);
                    h264e_dbg_slice("used bit %2d difference_of_pic_nums_minus1 %d\n",
                                    mpp_writer_bits(s), mmco.difference_of_pic_nums_minus1);
                } break;
                case 2 : {
                    /* long_term_pic_num */
                    mpp_writer_put_ue(s, mmco.long_term_pic_num );
                    h264e_dbg_slice("used bit %2d long_term_pic_num %d\n",
                                    mpp_writer_bits(s), mmco.long_term_pic_num);
                } break;
                case 3 : {
                    /* difference_of_pic_nums_minus1 */
                    mpp_writer_put_ue(s, mmco.difference_of_pic_nums_minus1);
                    h264e_dbg_slice("used bit %2d difference_of_pic_nums_minus1 %d\n",
                                    mpp_writer_bits(s), mmco.difference_of_pic_nums_minus1);

                    /* long_term_frame_idx */
                    mpp_writer_put_ue(s, mmco.long_term_frame_idx );
                    h264e_dbg_slice("used bit %2d long_term_frame_idx %d\n",
                                    mpp_writer_bits(s), mmco.long_term_frame_idx);
                } break;
                case 4 : {
                    /* max_long_term_frame_idx_plus1 */
                    mpp_writer_put_ue(s, mmco.max_long_term_frame_idx_plus1);
                    h264e_dbg_slice("used bit %2d max_long_term_frame_idx_plus1 %d\n",
                                    mpp_writer_bits(s), mmco.max_long_term_frame_idx_plus1);
                } break;
                case 5 : {
                } break;
                case 6 : {
                    /* long_term_frame_idx */
                    mpp_writer_put_ue(s, mmco.long_term_frame_idx);
                    h264e_dbg_slice("used bit %2d long_term_frame_idx %d\n",
                                    mpp_writer_bits(s), mmco.long_term_frame_idx);
                } break;
                default : {
                    mpp_err_f("invalid mmco %d\n", mmco.mmco);
                } break;
                }
            }

            /* memory_management_control_operation */
            mpp_writer_put_ue(s, 0);
            h264e_dbg_slice("used bit %2d memory_management_control_operation 0\n",
                            mpp_writer_bits(s));
        } else {
            /* adaptive_ref_pic_marking_mode_flag */
            mpp_writer_put_bits(s, 0, 1);
            h264e_dbg_slice("used bit %2d adaptive_ref_pic_marking_mode_flag 0\n",
                            mpp_writer_bits(s));
        }
    }
}